

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

int best_index_int8(int n,int8_t *val,float x)

{
  int iVar1;
  int local_24;
  int mav;
  int mu;
  int ml;
  float x_local;
  int8_t *val_local;
  int n_local;
  int local_4;
  
  if ((float)(int)*val < x) {
    if (x < (float)(int)val[n + -1]) {
      ml = 0;
      mu = n + -1;
      iVar1 = ml;
      while (ml = iVar1, 1 < mu - ml) {
        iVar1 = (ml + mu) / 2;
        if (x < (float)(int)val[iVar1]) {
          mu = iVar1;
          iVar1 = ml;
        }
      }
      if ((float)(int)val[mu] - x <= x - (float)(int)val[mu + -1]) {
        local_24 = mu;
      }
      else {
        local_24 = mu + -1;
      }
      local_4 = local_24;
    }
    else {
      local_4 = n + -1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int best_index_int8(int n, const int8_t * val, float x) {
    if (x <= val[0]) return 0;
    if (x >= val[n-1]) return n-1;
    int ml = 0, mu = n-1;
    while (mu-ml > 1) {
        int mav = (ml+mu)/2;
        if (x < val[mav]) mu = mav; else ml = mav;
    }
    return x - val[mu-1] < val[mu] - x ? mu-1 : mu;
}